

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue * build_arg_list(JSContext *ctx,uint32_t *plen,JSValue array_arg)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  JSValue *tab;
  long lVar4;
  JSValueUnion JVar5;
  int64_t *piVar6;
  ulong uVar7;
  JSValue JVar8;
  uint32_t len;
  uint local_44;
  ulong local_40;
  uint32_t *local_38;
  
  JVar5 = array_arg.u;
  if ((int)array_arg.tag != -1) {
    JS_ThrowTypeError(ctx,"not a object");
    return (JSValue *)0x0;
  }
  iVar3 = js_get_length32(ctx,&local_44,array_arg);
  if (iVar3 == 0) {
    local_40 = (ulong)local_44;
    if (0x10000 < local_40) {
      JS_ThrowInternalError(ctx,"too many arguments");
      return (JSValue *)0x0;
    }
    tab = (JSValue *)js_mallocz(ctx,(ulong)((local_44 + (local_44 == 0)) * 0x10));
    if (tab != (JSValue *)0x0) {
      local_38 = plen;
      if ((((*(short *)((long)JVar5.ptr + 6) == 8) || (*(short *)((long)JVar5.ptr + 6) == 2)) &&
          ((*(byte *)((long)JVar5.ptr + 5) & 8) != 0)) &&
         ((int)local_40 == *(int *)((long)JVar5.ptr + 0x40))) {
        for (lVar4 = 0; local_40 << 4 != lVar4; lVar4 = lVar4 + 0x10) {
          piVar1 = *(int **)(*(long *)((long)JVar5.ptr + 0x38) + lVar4);
          uVar2 = *(undefined8 *)(*(long *)((long)JVar5.ptr + 0x38) + 8 + lVar4);
          if (0xfffffff4 < (uint)uVar2) {
            *piVar1 = *piVar1 + 1;
          }
          *(int **)((long)&tab->u + lVar4) = piVar1;
          *(undefined8 *)((long)&tab->tag + lVar4) = uVar2;
        }
      }
      else {
        piVar6 = &tab->tag;
        for (uVar7 = 0; local_40 != uVar7; uVar7 = uVar7 + 1) {
          JVar8 = JS_GetPropertyUint32(ctx,array_arg,(uint32_t)uVar7);
          if ((int)JVar8.tag == 6) {
            free_arg_list(ctx,tab,(uint32_t)uVar7);
            return (JSValue *)0x0;
          }
          *(JSValueUnion *)(piVar6 + -1) = JVar8.u;
          *piVar6 = JVar8.tag;
          piVar6 = piVar6 + 2;
        }
      }
      *local_38 = (uint32_t)local_40;
      return tab;
    }
  }
  return (JSValue *)0x0;
}

Assistant:

static JSValue *build_arg_list(JSContext *ctx, uint32_t *plen,
                               JSValueConst array_arg)
{
    uint32_t len, i;
    JSValue *tab, ret;
    JSObject *p;

    if (JS_VALUE_GET_TAG(array_arg) != JS_TAG_OBJECT) {
        JS_ThrowTypeError(ctx, "not a object");
        return NULL;
    }
    if (js_get_length32(ctx, &len, array_arg))
        return NULL;
    if (len > JS_MAX_LOCAL_VARS) {
        JS_ThrowInternalError(ctx, "too many arguments");
        return NULL;
    }
    /* avoid allocating 0 bytes */
    tab = js_mallocz(ctx, sizeof(tab[0]) * max_uint32(1, len));
    if (!tab)
        return NULL;
    p = JS_VALUE_GET_OBJ(array_arg);
    if ((p->class_id == JS_CLASS_ARRAY || p->class_id == JS_CLASS_ARGUMENTS) &&
        p->fast_array &&
        len == p->u.array.count) {
        for(i = 0; i < len; i++) {
            tab[i] = JS_DupValue(ctx, p->u.array.u.values[i]);
        }
    } else {
        for(i = 0; i < len; i++) {
            ret = JS_GetPropertyUint32(ctx, array_arg, i);
            if (JS_IsException(ret)) {
                free_arg_list(ctx, tab, i);
                return NULL;
            }
            tab[i] = ret;
        }
    }
    *plen = len;
    return tab;
}